

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

int luaL_execresult(lua_State *L,int stat)

{
  char *what;
  int stat_local;
  lua_State *L_local;
  
  if (stat == -1) {
    L_local._4_4_ = luaL_fileresult(L,0,(char *)0x0);
  }
  else {
    if (stat == 0) {
      lua_pushboolean(L,1);
    }
    else {
      lua_pushnil(L);
    }
    lua_pushstring(L,"exit");
    lua_pushinteger(L,(long)stat);
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

LUALIB_API int luaL_execresult (lua_State *L, int stat) {
  const char *what = "exit";  /* type of termination */
  if (stat == -1)  /* error? */
    return luaL_fileresult(L, 0, NULL);
  else {
    inspectstat(stat, what);  /* interpret result */
    if (*what == 'e' && stat == 0)  /* successful termination? */
      lua_pushboolean(L, 1);
    else
      lua_pushnil(L);
    lua_pushstring(L, what);
    lua_pushinteger(L, stat);
    return 3;  /* return true/nil,what,code */
  }
}